

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmBitImEa<(moira::Instr)29,(moira::Mode)7,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  UInt u;
  StrWriter *this_00;
  Ea<(moira::Mode)7,_(moira::Size)1> dst;
  Ea<(moira::Mode)7,_(moira::Size)1> local_44;
  
  u.raw = dasmRead<(moira::Size)1>(this,addr);
  local_44.reg = op & 7;
  local_44.pc = *addr;
  local_44.ext1 = dasmRead<(moira::Size)2>(this,addr);
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Align)(this->tab).raw);
  StrWriter::operator<<(this_00,"#");
  StrWriter::operator<<(this_00,u);
  StrWriter::operator<<(this_00,", ");
  StrWriter::operator<<(this_00,&local_44);
  return;
}

Assistant:

void
Moira::dasmBitImEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = dasmRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << tab << "#" << UInt(src) << ", " << dst;
}